

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O2

wchar_t critical_shot(player *p,monster_conflict *monster,wchar_t weight,wchar_t plus,wchar_t dam,
                     _Bool launched,uint32_t *msg_type)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  critical_level *pcVar6;
  _Bool _Var7;
  uint32_t uVar8;
  critical_level *pcVar9;
  int iVar10;
  int iVar11;
  
  iVar10 = plus + (p->state).to_h;
  _Var7 = is_debuffed(monster);
  if (_Var7) {
    iVar10 = iVar10 + z_info->r_crit_debuff_toh;
  }
  iVar2 = z_info->r_crit_chance_weight_scl;
  iVar3 = z_info->r_crit_chance_toh_scl;
  sVar1 = p->lev;
  iVar4 = z_info->r_crit_chance_level_scl;
  iVar5 = z_info->r_crit_chance_offset;
  if (launched) {
    iVar11 = (p->state).skills[7] * z_info->r_crit_chance_launched_toh_skill_scl;
  }
  else {
    iVar11 = (p->state).skills[8] * z_info->r_crit_chance_thrown_toh_skill_scl;
  }
  uVar8 = Rand_div(z_info->r_crit_chance_range);
  if (((int)uVar8 < iVar10 * iVar3 + iVar2 * weight + iVar5 + sVar1 * iVar4 + iVar11) &&
     (z_info->r_crit_level_head != (critical_level *)0x0)) {
    iVar10 = z_info->r_crit_power_weight_scl;
    uVar8 = Rand_div(z_info->r_crit_power_random);
    pcVar6 = z_info->r_crit_level_head;
    do {
      pcVar9 = pcVar6;
      if (weight * iVar10 + uVar8 + L'\x01' < pcVar9->cutoff) break;
      pcVar6 = pcVar9->next;
    } while (pcVar9->next != (critical_level *)0x0);
    *msg_type = pcVar9->msgt;
    dam = dam * pcVar9->mult + pcVar9->add;
  }
  else {
    *msg_type = 0x55;
  }
  return dam;
}

Assistant:

static int critical_shot(const struct player *p,
		const struct monster *monster,
		int weight, int plus,
		int dam, bool launched, uint32_t *msg_type)
{
	int to_h = p->state.to_h + plus;
	int chance, new_dam;

	if (is_debuffed(monster)) {
		to_h += z_info->r_crit_debuff_toh;
	}
	chance = z_info->r_crit_chance_weight_scl * weight
		+ z_info->r_crit_chance_toh_scl * to_h
		+ z_info->r_crit_chance_level_scl * p->lev
		+ z_info->r_crit_chance_offset;
	if (launched) {
		chance += z_info->r_crit_chance_launched_toh_skill_scl
			* p->state.skills[SKILL_TO_HIT_BOW];
	} else {
		chance += z_info->r_crit_chance_thrown_toh_skill_scl
			* p->state.skills[SKILL_TO_HIT_THROW];
	}

	if (randint1(z_info->r_crit_chance_range) > chance
			|| !z_info->r_crit_level_head) {
		*msg_type = MSG_SHOOT_HIT;
		new_dam = dam;
	} else {
		int power = z_info->r_crit_power_weight_scl * weight
			+ randint1(z_info->r_crit_power_random);
		const struct critical_level *this_l = z_info->r_crit_level_head;

		while (power >= this_l->cutoff && this_l->next) {
			this_l = this_l->next;
		}
		*msg_type = this_l->msgt;
		new_dam = this_l->add + this_l->mult * dam;
	}

	return new_dam;
}